

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

TargetType __thiscall
cmExportBuildFileGenerator::GetExportTargetType
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType local_1c;
  TargetType targetType;
  cmGeneratorTarget *target_local;
  cmExportBuildFileGenerator *this_local;
  
  local_1c = cmGeneratorTarget::GetType(target);
  if (local_1c == OBJECT_LIBRARY) {
    bVar1 = cmTarget::HasKnownObjectFileLocation(target->Target,(string *)0x0);
    if (!bVar1) {
      local_1c = INTERFACE_LIBRARY;
    }
  }
  return local_1c;
}

Assistant:

cmStateEnums::TargetType cmExportBuildFileGenerator::GetExportTargetType(
  cmGeneratorTarget const* target) const
{
  cmStateEnums::TargetType targetType = target->GetType();
  // An object library exports as an interface library if we cannot
  // tell clients where to find the objects.  This is sufficient
  // to support transitive usage requirements on other targets that
  // use the object library.
  if (targetType == cmStateEnums::OBJECT_LIBRARY &&
      !target->Target->HasKnownObjectFileLocation(nullptr)) {
    targetType = cmStateEnums::INTERFACE_LIBRARY;
  }
  return targetType;
}